

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_records_feed_info.c
# Opt level: O2

void CGTFS_DatabaseFeedInfo(void)

{
  int iVar1;
  feed_db_status_t fVar2;
  feed_db_t db;
  feed_info_t local_242;
  
  iVar1 = greatest_test_pre("db_feed_info_store");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      memcpy(&local_242,"monroe-pa-us",0x212);
      init_feed_db(&db,"tests_tdw0.db",1);
      setup_feed_db(&db);
      fVar2 = store_feed_info_db(&local_242,&db);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (fVar2 == FEED_DB_SUCCESS) {
        free_feed_db(&db);
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      else {
        fwrite("\nExpected: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",1);
        fwrite("\n     Got: ",0xb,1,_stdout);
        fprintf(_stdout,"%i",(ulong)fVar2);
        fputc(10,_stdout);
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_database_records/tests-database_records_feed_info.c"
        ;
        greatest_info.fail_line = 0x1a;
        greatest_info.msg = db.error_msg;
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        iVar1 = -1;
      }
    }
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseFeedInfo) {
    RUN_TEST(db_feed_info_store);
}